

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O3

Component __thiscall
ftxui::Slider<long>(ftxui *this,ConstStringRef *label,long *value,long min,long max,long increment)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Component CVar1;
  undefined1 local_59;
  SliderBase<long> *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  long increment_local;
  long max_local;
  long min_local;
  long *value_local;
  
  local_58 = (SliderBase<long> *)0x0;
  increment_local = increment;
  max_local = max;
  min_local = min;
  value_local = value;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ftxui::SliderBase<long>,std::allocator<ftxui::SliderBase<long>>,ftxui::ConstStringRef&,long*&,long&,long&,long&>
            (a_Stack_50,&local_58,(allocator<ftxui::SliderBase<long>_> *)&local_59,label,
             &value_local,&min_local,&max_local,&increment_local);
  *(SliderBase<long> **)this = local_58;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = a_Stack_50[0]._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Component)CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Slider(ConstStringRef label, T* value, T min, T max, T increment) {
  return Make<SliderBase<T>>(std::move(label), value, min, max, increment);
}